

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

void __thiscall
tcu::Matrix<tcu::Interval,_2,_4>::Matrix
          (Matrix<tcu::Interval,_2,_4> *this,Matrix<tcu::Interval,_2,_4> *src)

{
  Vector<tcu::Vector<tcu::Interval,_2>,_4>::Vector(&this->m_data);
  operator=(this,src);
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const Matrix<T, Rows, Cols>& src)
{
	*this = src;
}